

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IndelLengthDistribution.cpp
# Opt level: O2

void __thiscall
IndelLengthDistribution::IndelLengthDistribution
          (IndelLengthDistribution *this,HistogramBasedDistribution *distribution)

{
  undefined8 in_RAX;
  int i;
  int value;
  double dVar1;
  int phred;
  undefined8 uStack_28;
  
  (this->phred_costs).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->phred_costs).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->phred_costs).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  uStack_28 = in_RAX;
  for (value = 0; value <= distribution->max; value = value + 1) {
    dVar1 = HistogramBasedDistribution::probability(distribution,value);
    dVar1 = log10(dVar1);
    dVar1 = round(dVar1 * -10.0);
    uStack_28 = CONCAT44((int)dVar1,(undefined4)uStack_28);
    std::vector<int,_std::allocator<int>_>::push_back
              (&this->phred_costs,(value_type_conflict2 *)((long)&uStack_28 + 4));
  }
  return;
}

Assistant:

IndelLengthDistribution::IndelLengthDistribution(const HistogramBasedDistribution& distribution) {
	for (int i=0; i<=distribution.maxValue(); ++i) {
		int phred = (int)round(-log10(distribution.probability(i))*10.0);
		phred_costs.push_back(phred);
	}
}